

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmorpher.cpp
# Opt level: O3

EffectState * __thiscall
anon_unknown.dwarf_1a0014::VmorpherStateFactory::create(VmorpherStateFactory *this)

{
  EffectState *__s;
  EffectState *pEVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  
  __s = (EffectState *)al_malloc(0x10,0x1c30);
  if (__s != (EffectState *)0x0) {
    memset(__s,0,0x1020);
    (__s->super_intrusive_ref<EffectState>).mRef.super___atomic_base<unsigned_int>._M_i = 1;
    (__s->mOutTarget).mData = (pointer)0x0;
    (__s->mOutTarget).mDataEnd = (pointer)0x0;
    __s->_vptr_EffectState = (_func_int **)&PTR__EffectState_001b00b8;
    pEVar1 = __s + 1;
    lVar3 = 0x20;
    do {
      lVar4 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(pEVar1->mOutTarget).mData + lVar4);
        *puVar2 = 0x3f80000000000000;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&pEVar1->_vptr_EffectState + lVar4);
        *puVar2 = 0x3f80000000000000;
        puVar2[1] = 0;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0x80);
      *(undefined8 *)((long)&__s[7].mOutTarget.mData + lVar3) = 0;
      *(undefined8 *)((long)&__s[7].mOutTarget.mDataEnd + lVar3) = 0;
      *(undefined8 *)((long)&__s[7]._vptr_EffectState + lVar3) = 0;
      *(undefined8 *)
       ((long)&__s[7].super_intrusive_ref<EffectState>.mRef.super___atomic_base<unsigned_int>._M_i +
       lVar3) = 0;
      *(undefined8 *)((long)&__s[6].mOutTarget.mData + lVar3) = 0;
      *(undefined8 *)((long)&__s[6].mOutTarget.mDataEnd + lVar3) = 0;
      *(undefined8 *)((long)&__s[6]._vptr_EffectState + lVar3) = 0;
      *(undefined8 *)
       ((long)&__s[6].super_intrusive_ref<EffectState>.mRef.super___atomic_base<unsigned_int>._M_i +
       lVar3) = 0;
      *(undefined8 *)((long)&__s[5].mOutTarget.mData + lVar3) = 0;
      *(undefined8 *)((long)&__s[5].mOutTarget.mDataEnd + lVar3) = 0;
      *(undefined8 *)((long)&__s[5]._vptr_EffectState + lVar3) = 0;
      *(undefined8 *)
       ((long)&__s[5].super_intrusive_ref<EffectState>.mRef.super___atomic_base<unsigned_int>._M_i +
       lVar3) = 0;
      *(undefined8 *)((long)&__s[4].mOutTarget.mData + lVar3) = 0;
      *(undefined8 *)((long)&__s[4].mOutTarget.mDataEnd + lVar3) = 0;
      *(undefined8 *)((long)&__s[4]._vptr_EffectState + lVar3) = 0;
      *(undefined8 *)
       ((long)&__s[4].super_intrusive_ref<EffectState>.mRef.super___atomic_base<unsigned_int>._M_i +
       lVar3) = 0;
      lVar3 = lVar3 + 0x100;
      pEVar1 = pEVar1 + 8;
    } while (lVar3 != 0x1020);
    __s[0x81]._vptr_EffectState = (_func_int **)0x0;
    *(undefined8 *)&__s[0x81].super_intrusive_ref<EffectState> = 0x100000000;
    memset(&__s[0x81].mOutTarget,0,0xc00);
    return __s;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = pthread_once;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

std::array<FormantFilter,4> VmorpherState::getFiltersByPhoneme(ALenum phoneme, float frequency, float pitch)
{
    /* Using soprano formant set of values to
     * better match mid-range frequency space.
     *
     * See: https://www.classes.cs.uchicago.edu/archive/1999/spring/CS295/Computing_Resources/Csound/CsManual3.48b1.HTML/Appendices/table3.html
     */
    switch(phoneme)
    {
    case AL_VOCAL_MORPHER_PHONEME_A:
        return {{
            {( 800 * pitch) / frequency, 1.000000f}, /* std::pow(10.0f,   0 / 20.0f); */
            {(1150 * pitch) / frequency, 0.501187f}, /* std::pow(10.0f,  -6 / 20.0f); */
            {(2900 * pitch) / frequency, 0.025118f}, /* std::pow(10.0f, -32 / 20.0f); */
            {(3900 * pitch) / frequency, 0.100000f}  /* std::pow(10.0f, -20 / 20.0f); */
        }};
    case AL_VOCAL_MORPHER_PHONEME_E:
        return {{
            {( 350 * pitch) / frequency, 1.000000f}, /* std::pow(10.0f,   0 / 20.0f); */
            {(2000 * pitch) / frequency, 0.100000f}, /* std::pow(10.0f, -20 / 20.0f); */
            {(2800 * pitch) / frequency, 0.177827f}, /* std::pow(10.0f, -15 / 20.0f); */
            {(3600 * pitch) / frequency, 0.009999f}  /* std::pow(10.0f, -40 / 20.0f); */
        }};
    case AL_VOCAL_MORPHER_PHONEME_I:
        return {{
            {( 270 * pitch) / frequency, 1.000000f}, /* std::pow(10.0f,   0 / 20.0f); */
            {(2140 * pitch) / frequency, 0.251188f}, /* std::pow(10.0f, -12 / 20.0f); */
            {(2950 * pitch) / frequency, 0.050118f}, /* std::pow(10.0f, -26 / 20.0f); */
            {(3900 * pitch) / frequency, 0.050118f}  /* std::pow(10.0f, -26 / 20.0f); */
        }};
    case AL_VOCAL_MORPHER_PHONEME_O:
        return {{
            {( 450 * pitch) / frequency, 1.000000f}, /* std::pow(10.0f,   0 / 20.0f); */
            {( 800 * pitch) / frequency, 0.281838f}, /* std::pow(10.0f, -11 / 20.0f); */
            {(2830 * pitch) / frequency, 0.079432f}, /* std::pow(10.0f, -22 / 20.0f); */
            {(3800 * pitch) / frequency, 0.079432f}  /* std::pow(10.0f, -22 / 20.0f); */
        }};
    case AL_VOCAL_MORPHER_PHONEME_U:
        return {{
            {( 325 * pitch) / frequency, 1.000000f}, /* std::pow(10.0f,   0 / 20.0f); */
            {( 700 * pitch) / frequency, 0.158489f}, /* std::pow(10.0f, -16 / 20.0f); */
            {(2700 * pitch) / frequency, 0.017782f}, /* std::pow(10.0f, -35 / 20.0f); */
            {(3800 * pitch) / frequency, 0.009999f}  /* std::pow(10.0f, -40 / 20.0f); */
        }};
    }
    return {};
}